

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O2

bool __thiscall libcellml::Annotator::assignIds(Annotator *this,CellmlElementType type)

{
  LoggerImpl *pLVar1;
  size_t sVar2;
  AnnotatorImpl *pAVar3;
  bool bVar4;
  ulong uVar5;
  shared_ptr<libcellml::Model> model;
  __shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2> local_58;
  pointer local_48;
  ComponentEntity local_40;
  
  pLVar1 = Logger::pFunc(&this->super_Logger);
  std::__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_58,
             &pLVar1[1].mMessages.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_finish);
  if (local_58._M_ptr == (element_type *)0x0) {
    pAVar3 = (AnnotatorImpl *)Logger::pFunc(&this->super_Logger);
    AnnotatorImpl::addIssueNoModel(pAVar3);
    bVar4 = false;
  }
  else {
    pLVar1 = Logger::pFunc(&this->super_Logger);
    local_48 = pLVar1[1].mMessages.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_start;
    switch(type) {
    case COMPONENT:
    case COMPONENT_REF:
    case CONNECTION:
    case MAP_VARIABLES:
    case RESET:
    case RESET_VALUE:
    case TEST_VALUE:
    case VARIABLE:
      for (uVar5 = 0;
          sVar2 = ComponentEntity::componentCount(&(local_58._M_ptr)->super_ComponentEntity),
          uVar5 < sVar2; uVar5 = uVar5 + 1) {
        pAVar3 = (AnnotatorImpl *)Logger::pFunc(&this->super_Logger);
        ComponentEntity::component(&local_40,(size_t)local_58._M_ptr);
        AnnotatorImpl::doSetComponentTreeTypeIds(pAVar3,(ComponentPtr *)&local_40,type,false);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &local_40.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl);
      }
      break;
    case ENCAPSULATION:
      pAVar3 = (AnnotatorImpl *)Logger::pFunc(&this->super_Logger);
      AnnotatorImpl::doSetEncapsulationIds(pAVar3);
      break;
    case IMPORT:
      pAVar3 = (AnnotatorImpl *)Logger::pFunc(&this->super_Logger);
      AnnotatorImpl::doSetImportSourceIds(pAVar3);
      break;
    case MODEL:
      pAVar3 = (AnnotatorImpl *)Logger::pFunc(&this->super_Logger);
      AnnotatorImpl::doSetModelIds(pAVar3);
      break;
    case UNIT:
      pAVar3 = (AnnotatorImpl *)Logger::pFunc(&this->super_Logger);
      AnnotatorImpl::doSetUnitsItemIds(pAVar3);
      break;
    case UNITS:
      pAVar3 = (AnnotatorImpl *)Logger::pFunc(&this->super_Logger);
      AnnotatorImpl::doSetUnitsIds(pAVar3);
    }
    setModel(this,(ModelPtr *)&local_58);
    pLVar1 = Logger::pFunc(&this->super_Logger);
    bVar4 = local_48 <
            pLVar1[1].mMessages.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  return bVar4;
}

Assistant:

bool Annotator::assignIds(CellmlElementType type)
{
    auto model = pFunc()->mModel.lock();
    if (model == nullptr) {
        pFunc()->addIssueNoModel();
        return false;
    }

    size_t initialSize = pFunc()->idCount();

    switch (type) {
    case CellmlElementType::COMPONENT:
    case CellmlElementType::COMPONENT_REF:
    case CellmlElementType::CONNECTION:
    case CellmlElementType::MAP_VARIABLES:
    case CellmlElementType::RESET:
    case CellmlElementType::RESET_VALUE:
    case CellmlElementType::TEST_VALUE:
    case CellmlElementType::VARIABLE:
        for (size_t index = 0; index < model->componentCount(); ++index) {
            pFunc()->doSetComponentTreeTypeIds(model->component(index), type);
        }
        break;
    case CellmlElementType::ENCAPSULATION:
        pFunc()->doSetEncapsulationIds();
        break;
    case CellmlElementType::IMPORT:
        pFunc()->doSetImportSourceIds();
        break;
    case CellmlElementType::MODEL:
        pFunc()->doSetModelIds();
        break;
    case CellmlElementType::UNIT:
        pFunc()->doSetUnitsItemIds();
        break;
    case CellmlElementType::UNITS:
        pFunc()->doSetUnitsIds();
        break;
    case CellmlElementType::MATH:
    default: /* case CellmlElementType::UNDEFINED */
        break;
    }

    setModel(model);

    return pFunc()->idCount() > initialSize;
}